

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomWalkUtils.h
# Opt level: O1

OrderedEdgeCollection *
GetEdgesByRandomWalk
          (OrderedEdgeCollection *__return_storage_ptr__,size_type *cg,long params,
          undefined4 param_4)

{
  size_type sVar1;
  ulong uVar2;
  result_type rVar3;
  ulong uVar4;
  long lVar5;
  VertexIdx VVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  vector<bool,_std::allocator<bool>_> visited_vertex_set;
  uniform_int_distribution<long> dist_parent_nbor;
  vector<bool,_std::allocator<bool>_> visited_edge_set;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> local_1468;
  long local_1450;
  undefined4 local_1444;
  vector<bool,_std::allocator<bool>_> local_1440;
  uniform_int_distribution<long> local_1418;
  vector<bool,_std::allocator<bool>_> local_1408;
  VertexIdx local_13e0;
  OrderedEdgeCollection *local_13d8;
  long local_13d0;
  long local_13c8;
  long local_13c0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  sVar1 = *cg;
  lVar7 = *(long *)(params + 0x20);
  local_1450 = *(long *)(params + 0x40);
  local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (OrderedEdge *)0x0;
  local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (OrderedEdge *)0x0;
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffffffffff00;
  local_1444 = param_4;
  local_13c8 = params;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_1408,cg[1],(bool *)&local_13b8,(allocator_type *)&local_1440);
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_1440,sVar1,(bool *)&local_13b8,(allocator_type *)&local_1418);
  if (lVar7 < 1) {
    VVar6 = 0;
  }
  else {
    local_13e0 = 0;
    if (0 < local_1450) {
      local_13e0 = local_1450;
    }
    local_13e0 = local_13e0 * lVar7;
    lVar5 = 0;
    local_13d8 = __return_storage_ptr__;
    local_13d0 = lVar7;
    do {
      uVar2 = *(ulong *)(*(long *)(local_13c8 + 0x28) + lVar5 * 8);
      local_13c0 = lVar5;
      if (*(long *)(cg[2] + 8 + uVar2 * 8) == *(long *)(cg[2] + uVar2 * 8)) {
        memcpy(&local_13b8,
               &edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                super__Vector_impl_data._M_finish,5000);
        local_1418._M_param._M_b = *cg - 1;
        local_1418._M_param._M_a = 0;
        uVar8 = 0;
        do {
          printf("BAd luck! Trying again %d\n",uVar8);
          uVar2 = std::uniform_int_distribution<long>::operator()
                            (&local_1418,&local_13b8,&local_1418._M_param);
          if (0x3e6 < (uint)uVar8) break;
          uVar8 = (ulong)((uint)uVar8 + 1);
        } while (*(long *)(cg[2] + 8 + uVar2 * 8) == *(long *)(cg[2] + uVar2 * 8));
      }
      lVar7 = local_1450;
      if (0 < local_1450) {
        do {
          sVar1 = cg[2];
          uVar10 = *(long *)(sVar1 + 8 + uVar2 * 8) - *(long *)(sVar1 + uVar2 * 8);
          local_1418._M_param._M_b = uVar10 - 1;
          local_1418._M_param._M_a = 0;
          lVar5 = *(long *)(sVar1 + uVar2 * 8);
          rVar3 = std::uniform_int_distribution<long>::operator()
                            (&local_1418,
                             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                              *)&edge_list.
                                 super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_1418._M_param);
          uVar9 = rVar3 + lVar5;
          uVar8 = *(ulong *)(cg[3] + uVar9 * 8);
          local_13b8._M_x[3] = uVar10;
          local_13b8._M_x[0] = uVar2;
          local_13b8._M_x[1] = uVar8;
          local_13b8._M_x[2] = uVar9;
          if ((char)local_1444 == '\0') {
            if (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_001051e4;
            std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::_M_realloc_insert<OrderedEdge>
                      (&local_1468,
                       (iterator)
                       local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(OrderedEdge *)&local_13b8);
          }
          else {
            local_13b8._M_x[3] = *(long *)(cg[2] + 8 + uVar8 * 8) - *(long *)(cg[2] + uVar8 * 8);
            local_13b8._M_x[0] = uVar8;
            local_13b8._M_x[1] = uVar2;
            if (((long)uVar10 <= (long)local_13b8._M_x[3]) &&
               (((long)uVar2 <= (long)uVar8 || (local_13b8._M_x[3] != uVar10)))) {
              local_13b8._M_x[3] = uVar10;
              local_13b8._M_x[0] = uVar2;
              local_13b8._M_x[1] = uVar8;
            }
            if (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::_M_realloc_insert<OrderedEdge>
                        (&local_1468,
                         (iterator)
                         local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(OrderedEdge *)&local_13b8);
            }
            else {
LAB_001051e4:
              (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
               super__Vector_impl_data._M_finish)->index = uVar9;
              (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
               super__Vector_impl_data._M_finish)->degree = local_13b8._M_x[3];
              (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
               super__Vector_impl_data._M_finish)->u = local_13b8._M_x[0];
              (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
               super__Vector_impl_data._M_finish)->v = local_13b8._M_x[1];
              local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar4 = uVar9 + 0x3f;
          if (-1 < (long)uVar9) {
            uVar4 = uVar9;
          }
          local_1408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar4 >> 6) + ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
               local_1408.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar4 >> 6) +
                ((ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
               1L << ((byte)uVar9 & 0x3f);
          uVar9 = uVar2 + 0x3f;
          if (-1 < (long)uVar2) {
            uVar9 = uVar2;
          }
          local_1440.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar9 >> 6) + ((ulong)((uVar2 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
               local_1440.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar9 >> 6) +
                ((ulong)((uVar2 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
               1L << ((byte)uVar2 & 0x3f);
          lVar7 = lVar7 + -1;
          uVar2 = uVar8;
        } while (lVar7 != 0);
      }
      lVar5 = local_13c0 + 1;
      VVar6 = local_13e0;
      __return_storage_ptr__ = local_13d8;
    } while (lVar5 != local_13d0);
  }
  __return_storage_ptr__->no_of_edges = local_1450;
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
            (&__return_storage_ptr__->edge_list,&local_1468);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&__return_storage_ptr__->visited_edge_set,&local_1408);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&__return_storage_ptr__->visited_vertex_set,&local_1440);
  __return_storage_ptr__->no_of_query = VVar6;
  if (local_1440.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1440.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_1440.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_1440.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_1440.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1440.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_1440.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1440.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_offset = 0;
    local_1440.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_1408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1408.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_1408.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_1408.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_1408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_1408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_1408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_offset = 0;
    local_1408.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1468.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

OrderedEdgeCollection GetEdgesByRandomWalk(CGraph *cg, Parameters params, std::mt19937 mt, bool is_degree_orered = false) {
    /**
     * Setting of various input parameters for executing the algorithm
     */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges;
    VertexIdx seed_count = params.seed_count; // We are working with only one seed vertex for this project
    EdgeIdx walk_length = params.walk_length;

    /**
     * Data structures for book-keeping and storing the edges found by the random walk
     */
    std::vector<OrderedEdge> edge_list;
    std::vector<bool > visited_edge_set(m,false);
    std::vector<bool > visited_vertex_set(n,false);
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm

    /**
     * Local variables
     */
    VertexIdx parent, child,deg_of_parent, deg_of_child;

    for (VertexIdx sC = 0; sC < seed_count; sC++) {

         VertexIdx seed = params.seed_vertices[sC]; // Random seed vertex is already in the params structure.
            parent = seed;
            deg_of_parent = cg->degree(parent); // degree of parent vertex
            if (deg_of_parent == 0)  // If we are stuck with an isolate vertex, we change the seed
                parent = AlternateSeed(cg,mt);

            for (EdgeIdx wL = 0; wL < walk_length; wL++) { // Perform a random walk of length walk_length from the seed vertex and collect the edges
                deg_of_parent = cg->degree(parent); // degree of parent vertex
                std::uniform_int_distribution<VertexIdx> dist_parent_nbor(0, deg_of_parent - 1);
                EdgeIdx random_nbor_edge = cg->offsets[parent] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
                no_of_query++; // One query to the uniform random neighbor oracle
                child = cg->nbors[random_nbor_edge]; // child is the next vertex on the random walk
                deg_of_child = cg->degree(child); //degree of child vertex

                /**
                 * Update the edge collection data structure with relevant information about the edge
                 */
                if (is_degree_orered) {
                    VertexIdx u, v, low_deg;
                    if (deg_of_child < deg_of_parent || (deg_of_child == deg_of_parent && child < parent)) {
                        u = child;
                        v = parent;
                        low_deg = deg_of_child;
                    } else {
                        u = parent;
                        v = child;
                        low_deg = deg_of_parent;
                    }
                    edge_list.push_back(OrderedEdge{u, v, random_nbor_edge, low_deg});
                }
                else {
                    edge_list.push_back(OrderedEdge{parent, child, random_nbor_edge, deg_of_parent});
                }

                /**
                 * Update the book-keeping data structure with the visited edge and vertices
                 */
                visited_edge_set[random_nbor_edge] = true;
                visited_vertex_set[parent] = true;
                parent = child; // The random walk proceeds with the vertex child
            }
        }

    OrderedEdgeCollection returnEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set,no_of_query};
    return returnEdgeCollection;
}